

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_dn_gets(char *buf,size_t size,mbedtls_x509_name *dn)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ulong __maxlen;
  char *pcVar5;
  bool bVar6;
  char *pcStack_1a0;
  int print_hexstring;
  char *p;
  char s [256];
  char highbits;
  char *pcStack_88;
  char lowbits;
  char *short_name;
  mbedtls_x509_name *name;
  uchar merge;
  uchar *puStack_70;
  uchar c;
  uchar *asn1_len_p;
  long lStack_60;
  uchar asn1_tag_len_buf [6];
  size_t asn1_tag_len_buf_start;
  size_t asn1_tag_size;
  size_t asn1_len_size;
  size_t n;
  size_t j;
  size_t i;
  int ret;
  mbedtls_x509_name *dn_local;
  size_t size_local;
  char *buf_local;
  
  name._6_1_ = '\0';
  pcStack_88 = (char *)0x0;
  memset(&p,0,0x100);
  pcStack_1a0 = buf;
  short_name = (char *)dn;
  asn1_len_size = size;
  while( true ) {
    while( true ) {
      if (short_name == (char *)0x0) {
        return (int)size - (int)asn1_len_size;
      }
      if (*(long *)(short_name + 0x10) != 0) break;
      short_name = *(char **)(short_name + 0x30);
    }
    if ((mbedtls_x509_name *)short_name != dn) {
      pcVar5 = ", ";
      if (name._6_1_ != '\0') {
        pcVar5 = " + ";
      }
      iVar3 = snprintf(pcStack_1a0,asn1_len_size,pcVar5);
      if ((iVar3 < 0) || (asn1_len_size <= (ulong)(long)iVar3)) {
        return -0x2980;
      }
      asn1_len_size = asn1_len_size - (long)iVar3;
      pcStack_1a0 = pcStack_1a0 + iVar3;
    }
    bVar6 = false;
    if ((*(int *)(short_name + 0x18) != 0xc) && (bVar6 = false, *(int *)(short_name + 0x18) != 0x13)
       ) {
      bVar6 = *(int *)(short_name + 0x18) != 0x16;
    }
    iVar3 = mbedtls_oid_get_attr_short_name((mbedtls_asn1_buf *)short_name,&stack0xffffffffffffff78)
    ;
    if (iVar3 == 0) {
      i._4_4_ = snprintf(pcStack_1a0,asn1_len_size,"%s=",pcStack_88);
    }
    else {
      iVar3 = mbedtls_oid_get_numeric_string
                        (pcStack_1a0,asn1_len_size,(mbedtls_asn1_buf *)short_name);
      if (iVar3 < 1) {
        if (iVar3 == -0xb) {
          return -0x2980;
        }
        i._4_4_ = snprintf(pcStack_1a0,asn1_len_size,"??=");
      }
      else {
        asn1_len_size = asn1_len_size - (long)iVar3;
        pcStack_1a0 = pcStack_1a0 + iVar3;
        i._4_4_ = snprintf(pcStack_1a0,asn1_len_size,"=");
        bVar6 = true;
      }
    }
    if ((i._4_4_ < 0) || (asn1_len_size <= (ulong)(long)i._4_4_)) break;
    __maxlen = asn1_len_size - (long)i._4_4_;
    if (bVar6) {
      p._0_1_ = 0x23;
      puStack_70 = (uchar *)&stack0xffffffffffffffa0;
      iVar3 = mbedtls_asn1_write_len
                        (&stack0xffffffffffffff90,(uchar *)((long)&asn1_len_p + 2),
                         *(size_t *)(short_name + 0x20));
      if (iVar3 < 0) {
        return -0x6e;
      }
      iVar4 = mbedtls_asn1_write_tag
                        (&stack0xffffffffffffff90,(uchar *)((long)&asn1_len_p + 2),
                         (uchar)*(undefined4 *)(short_name + 0x18));
      if (iVar4 < 0) {
        return -0x6e;
      }
      lStack_60 = (6 - (long)iVar3) - (long)iVar4;
      n = 1;
      for (j = 0; j < (ulong)((long)iVar3 + (long)iVar4); j = j + 1) {
        if (0xfe < n + 1) {
          return -0x2980;
        }
        name._7_1_ = *(byte *)((long)&asn1_len_p + lStack_60 + j + 2);
        bVar1 = name._7_1_ & 0xf;
        cVar2 = nibble_to_hex_digit((int)(char)((int)(uint)name._7_1_ >> 4));
        s[n - 8] = cVar2;
        cVar2 = nibble_to_hex_digit((int)(char)bVar1);
        s[n - 7] = cVar2;
        n = n + 2;
      }
      for (j = 0; j < *(ulong *)(short_name + 0x20); j = j + 1) {
        if (0xfe < n + 1) {
          return -0x2980;
        }
        name._7_1_ = *(byte *)(*(long *)(short_name + 0x28) + j);
        bVar1 = name._7_1_ & 0xf;
        cVar2 = nibble_to_hex_digit((int)(char)((int)(uint)name._7_1_ >> 4));
        s[n - 8] = cVar2;
        cVar2 = nibble_to_hex_digit((int)(char)bVar1);
        s[n - 7] = cVar2;
        n = n + 2;
      }
    }
    else {
      n = 0;
      for (j = 0; j < *(ulong *)(short_name + 0x20); j = j + 1) {
        if (0xfe < n) {
          return -0x2980;
        }
        name._7_1_ = *(byte *)(*(long *)(short_name + 0x28) + j);
        if (name._7_1_ == 0) {
          return -0x2380;
        }
        pcVar5 = strchr(",=+<>;\"\\",(uint)name._7_1_);
        if (((pcVar5 != (char *)0x0) ||
            ((j == 0 && (pcVar5 = strchr("# ",(uint)name._7_1_), pcVar5 != (char *)0x0)))) ||
           ((j == *(long *)(short_name + 0x20) - 1U && (name._7_1_ == 0x20)))) {
          if (0xfe < n + 1) {
            return -0x2980;
          }
          s[n - 8] = '\\';
          n = n + 1;
        }
        if ((name._7_1_ < 0x20) || (0x7e < name._7_1_)) {
          if (0xfe < n + 3) {
            return -0x2980;
          }
          s[n - 8] = '\\';
          bVar1 = name._7_1_ & 0xf;
          cVar2 = nibble_to_hex_digit((int)(char)((int)(uint)name._7_1_ >> 4));
          s[n - 7] = cVar2;
          cVar2 = nibble_to_hex_digit((int)(char)bVar1);
          s[n - 6] = cVar2;
          n = n + 2;
        }
        else {
          s[n - 8] = name._7_1_;
        }
        n = n + 1;
      }
    }
    s[n - 8] = '\0';
    iVar3 = snprintf(pcStack_1a0 + i._4_4_,__maxlen,"%s",&p);
    if ((iVar3 < 0) || (__maxlen <= (ulong)(long)iVar3)) {
      return -0x2980;
    }
    asn1_len_size = __maxlen - (long)iVar3;
    pcStack_1a0 = pcStack_1a0 + i._4_4_ + iVar3;
    name._6_1_ = short_name[0x38];
    short_name = *(char **)(short_name + 0x30);
  }
  return -0x2980;
}

Assistant:

int mbedtls_x509_dn_gets(char *buf, size_t size, const mbedtls_x509_name *dn)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j, n, asn1_len_size, asn1_tag_size, asn1_tag_len_buf_start;
    /* 6 is enough as our asn1 write functions only write one byte for the tag and at most five bytes for the length*/
    unsigned char asn1_tag_len_buf[6];
    unsigned char *asn1_len_p;
    unsigned char c, merge = 0;
    const mbedtls_x509_name *name;
    const char *short_name = NULL;
    char lowbits, highbits;
    char s[MBEDTLS_X509_MAX_DN_NAME_SIZE], *p;
    int print_hexstring;

    memset(s, 0, sizeof(s));

    name = dn;
    p = buf;
    n = size;

    while (name != NULL) {
        if (!name->oid.p) {
            name = name->next;
            continue;
        }

        if (name != dn) {
            ret = mbedtls_snprintf(p, n, merge ? " + " : ", ");
            MBEDTLS_X509_SAFE_SNPRINTF;
        }

        print_hexstring = (name->val.tag != MBEDTLS_ASN1_UTF8_STRING) &&
                          (name->val.tag != MBEDTLS_ASN1_PRINTABLE_STRING) &&
                          (name->val.tag != MBEDTLS_ASN1_IA5_STRING);

        if ((ret = mbedtls_oid_get_attr_short_name(&name->oid, &short_name)) == 0) {
            ret = mbedtls_snprintf(p, n, "%s=", short_name);
        } else {
            if ((ret = mbedtls_oid_get_numeric_string(p, n, &name->oid)) > 0) {
                n -= ret;
                p += ret;
                ret = mbedtls_snprintf(p, n, "=");
                print_hexstring = 1;
            } else if (ret == MBEDTLS_ERR_OID_BUF_TOO_SMALL) {
                return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
            } else {
                ret = mbedtls_snprintf(p, n, "\?\?=");
            }
        }
        MBEDTLS_X509_SAFE_SNPRINTF;

        if (print_hexstring) {
            s[0] = '#';

            asn1_len_p = asn1_tag_len_buf + sizeof(asn1_tag_len_buf);
            if ((ret = mbedtls_asn1_write_len(&asn1_len_p, asn1_tag_len_buf, name->val.len)) < 0) {
                return MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
            }
            asn1_len_size = ret;
            if ((ret = mbedtls_asn1_write_tag(&asn1_len_p, asn1_tag_len_buf, name->val.tag)) < 0) {
                return MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
            }
            asn1_tag_size = ret;
            asn1_tag_len_buf_start = sizeof(asn1_tag_len_buf) - asn1_len_size - asn1_tag_size;
            for (i = 0, j = 1; i < asn1_len_size + asn1_tag_size; i++) {
                if (j + 1 >= sizeof(s) - 1) {
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }
                c = asn1_tag_len_buf[asn1_tag_len_buf_start+i];
                lowbits = (c & 0x0F);
                highbits = c >> 4;
                s[j++] = nibble_to_hex_digit(highbits);
                s[j++] = nibble_to_hex_digit(lowbits);
            }
            for (i = 0; i < name->val.len; i++) {
                if (j + 1 >= sizeof(s) - 1) {
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }
                c = name->val.p[i];
                lowbits = (c & 0x0F);
                highbits = c >> 4;
                s[j++] = nibble_to_hex_digit(highbits);
                s[j++] = nibble_to_hex_digit(lowbits);
            }
        } else {
            for (i = 0, j = 0; i < name->val.len; i++, j++) {
                if (j >= sizeof(s) - 1) {
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }

                c = name->val.p[i];
                // Special characters requiring escaping, RFC 4514 Section 2.4
                if (c == '\0') {
                    return MBEDTLS_ERR_X509_INVALID_NAME;
                } else {
                    if (strchr(",=+<>;\"\\", c) ||
                        ((i == 0) && strchr("# ", c)) ||
                        ((i == name->val.len-1) && (c == ' '))) {
                        if (j + 1 >= sizeof(s) - 1) {
                            return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                        }
                        s[j++] = '\\';
                    }
                }
                if (c < 32 || c >= 127) {
                    if (j + 3 >= sizeof(s) - 1) {
                        return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                    }
                    s[j++] = '\\';
                    lowbits = (c & 0x0F);
                    highbits = c >> 4;
                    s[j++] = nibble_to_hex_digit(highbits);
                    s[j] = nibble_to_hex_digit(lowbits);
                } else {
                    s[j] = c;
                }
            }
        }
        s[j] = '\0';
        ret = mbedtls_snprintf(p, n, "%s", s);
        MBEDTLS_X509_SAFE_SNPRINTF;

        merge = name->next_merged;
        name = name->next;
    }

    return (int) (size - n);
}